

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O3

void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *p,Fxu_Var *pVar)

{
  Fxu_Var **ppFVar1;
  int iVar2;
  Fxu_Lit *pFVar3;
  Fxu_Var **ppFVar4;
  Fxu_Lit *pFVar5;
  Fxu_Matrix *p_00;
  Fxu_Var *pVar1;
  
  ppFVar1 = &p->pOrderVars;
  p->ppTailVars = ppFVar1;
  p->pOrderVars = (Fxu_Var *)0x0;
  pFVar3 = (pVar->lLits).pHead;
  ppFVar4 = ppFVar1;
  p_00 = p;
  if (pFVar3 != (Fxu_Lit *)0x0) {
    do {
      for (pFVar5 = pFVar3->pHPrev; pFVar5 != (Fxu_Lit *)0x0; pFVar5 = pFVar5->pHPrev) {
        p_00 = (Fxu_Matrix *)pFVar5->pVar;
        if (*(Fxu_Var **)&p_00->nTableSize == (Fxu_Var *)0x0) {
          *ppFVar4 = (Fxu_Var *)p_00;
          ppFVar4 = (Fxu_Var **)&p_00->nTableSize;
          p->ppTailVars = ppFVar4;
          *(Fxu_Var **)&p_00->nTableSize = (Fxu_Var *)0x1;
        }
      }
      pFVar3 = pFVar3->pVNext;
    } while (pFVar3 != (Fxu_Lit *)0x0);
    pVar1 = *ppFVar1;
    if ((Fxu_Var *)0x1 < pVar1) {
      do {
        iVar2 = Fxu_SingleCountCoincidence(p_00,pVar1,pVar);
        if (iVar2 < 1) {
          __assert_fail("Coin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuSingle.c"
                        ,0xd9,"void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *, Fxu_Var *)");
        }
        if (p->nWeightLimit <= iVar2 + -2) {
          p_00 = p;
          Fxu_MatrixAddSingle(p,pVar1,pVar,iVar2 + -2);
        }
        pVar1 = pVar1->pOrder;
      } while (pVar1 != (Fxu_Var *)0x1);
    }
  }
  Fxu_MatrixRingVarsUnmark(p);
  return;
}

Assistant:

void Fxu_MatrixComputeSinglesOne( Fxu_Matrix * p, Fxu_Var * pVar )
{
    Fxu_Lit * pLitV, * pLitH;
    Fxu_Var * pVar2;
    int Coin;
    int WeightCur;

    // start collecting the affected vars
    Fxu_MatrixRingVarsStart( p );
    // go through all the literals of this variable
    for ( pLitV = pVar->lLits.pHead; pLitV; pLitV = pLitV->pVNext )
        // for this literal, go through all the horizontal literals
        for ( pLitH = pLitV->pHPrev; pLitH; pLitH = pLitH->pHPrev )
        {
            // get another variable
            pVar2 = pLitH->pVar;
            // skip the var if it is already used
            if ( pVar2->pOrder )
                continue;
            // skip the var if it belongs to the same node
//            if ( pValue2Node[pVar->iVar] == pValue2Node[pVar2->iVar] )
//                continue;
            // collect the var
            Fxu_MatrixRingVarsAdd( p, pVar2 );
        }
    // stop collecting the selected vars
    Fxu_MatrixRingVarsStop( p );

    // iterate through the selected vars
    Fxu_MatrixForEachVarInRing( p, pVar2 )
    {
        // count the coincidence
        Coin = Fxu_SingleCountCoincidence( p, pVar2, pVar );
        assert( Coin > 0 );
        // get the new weight
        WeightCur = Coin - 2;
        // peformance fix (August 24, 2007)
//        if ( WeightCur >= 0 )
//        Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
        if ( WeightCur >= p->nWeightLimit )
            Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
    }
    // unmark the vars
    Fxu_MatrixRingVarsUnmark( p );
}